

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O0

int gazemu(monst *mtmp,attack *mattk)

{
  boolean bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  int blnd;
  int stun;
  int conf;
  boolean useeit;
  attack *mattk_local;
  monst *mtmp_local;
  
  switch(mattk->adtyp) {
  case '\x02':
    if ((*(uint *)&mtmp->field_0x60 >> 8 & 1) != 0) {
      return 0;
    }
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_002279f8;
      if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
         || (((youmonst.data)->mflags1 & 0x1000) != 0)) {
        if (ublindf == (obj *)0x0) {
          return 0;
        }
        if (ublindf->oartifact != '\x1d') {
          return 0;
        }
      }
      if (((u.uprops[0x40].intrinsic == 0) && (u.uprops[0x40].extrinsic == 0)) &&
         (((youmonst.data)->mflags3 & 0x100) == 0)) {
        return 0;
      }
      if ((mtmp->data->mflags3 & 0x200) == 0) {
        return 0;
      }
      bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
    }
    else {
      bVar2 = worm_known(level,mtmp);
    }
    if (bVar2 == 0) {
      return 0;
    }
LAB_002279f8:
    if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
         ((u.uprops[0xc].extrinsic != 0 || (((youmonst.data)->mflags1 & 0x1000000) != 0)))) &&
        (((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)
         ))) && ((((byte)u._1052_1_ >> 5 & 1) == 0 &&
                 (((((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 &&
                    ((*(uint *)&mtmp->field_0x60 >> 0x11 & 1) != 0)) && (mtmp->mspec_used == 0)) &&
                  (iVar3 = rn2(5), iVar3 != 0)))))) {
      pcVar6 = Monnam(mtmp);
      pline("%s attacks you with a fiery gaze!",pcVar6);
      iVar3 = dice(2,6);
      fire_damageu(iVar3,mtmp,(char *)0x0,0,(uint)mtmp->m_lev,'\x01','\0');
      stop_occupation();
    }
    return 0;
  default:
    warning("Gaze attack %d?",(ulong)mattk->adtyp);
    return 0;
  case '\v':
    if ((*(uint *)&mtmp->field_0x60 >> 8 & 1) != 0) {
      return 0;
    }
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_002276bd;
      if ((u.uprops[0x1e].intrinsic != 0) ||
         (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
          (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
        if (ublindf == (obj *)0x0) {
          return 0;
        }
        if (ublindf->oartifact != '\x1d') {
          return 0;
        }
      }
      if (((u.uprops[0x40].intrinsic == 0) && (u.uprops[0x40].extrinsic == 0)) &&
         (((youmonst.data)->mflags3 & 0x100) == 0)) {
        return 0;
      }
      if ((mtmp->data->mflags3 & 0x200) == 0) {
        return 0;
      }
      bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
    }
    else {
      bVar2 = worm_known(level,mtmp);
    }
    if (bVar2 == 0) {
      return 0;
    }
LAB_002276bd:
    if ((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
       ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) {
      return 0;
    }
    if ((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0) {
      return 0;
    }
    if ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0) {
      return 0;
    }
    if (((byte)u._1052_1_ >> 5 & 1) != 0) {
      return 0;
    }
    bVar1 = resists_blnd(&youmonst);
    if (bVar1 != '\0') {
      return 0;
    }
    iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
    if (0x40 < iVar3) {
      return 0;
    }
    iVar3 = dice((uint)mattk->damn,(uint)mattk->damd);
    pcVar6 = mon_nam(mtmp);
    s_suffix(pcVar6);
    pline("You are blinded by %s radiance!");
    make_blinded((long)iVar3,'\0');
    stop_occupation();
    if (((u.uprops[0x1e].intrinsic != 0) ||
        (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
         (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
       ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
      iVar3 = dice(1,3);
      make_stunned((long)iVar3,'\x01');
      return 0;
    }
    pline("Your vision quickly clears.");
    return 0;
  case '\f':
    if ((*(uint *)&mtmp->field_0x60 >> 8 & 1) != 0) {
      return 0;
    }
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_002273ce;
      if ((u.uprops[0x1e].intrinsic != 0) ||
         (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
          (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
        if (ublindf == (obj *)0x0) {
          return 0;
        }
        if (ublindf->oartifact != '\x1d') {
          return 0;
        }
      }
      if (((u.uprops[0x40].intrinsic == 0) && (u.uprops[0x40].extrinsic == 0)) &&
         (((youmonst.data)->mflags3 & 0x100) == 0)) {
        return 0;
      }
      if ((mtmp->data->mflags3 & 0x200) == 0) {
        return 0;
      }
      bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
    }
    else {
      bVar2 = worm_known(level,mtmp);
    }
    if (bVar2 == 0) {
      return 0;
    }
LAB_002273ce:
    if ((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
       ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) {
      return 0;
    }
    if ((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0) {
      return 0;
    }
    if ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0) {
      return 0;
    }
    if (((byte)u._1052_1_ >> 5 & 1) != 0) {
      return 0;
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
      return 0;
    }
    if ((*(uint *)&mtmp->field_0x60 >> 0x11 & 1) == 0) {
      return 0;
    }
    if (mtmp->mspec_used != 0) {
      return 0;
    }
    iVar3 = rn2(5);
    if (iVar3 == 0) {
      return 0;
    }
    iVar4 = dice(2,6);
    iVar3 = mtmp->mspec_used;
    iVar5 = rn2(6);
    mtmp->mspec_used = iVar3 + iVar4 + iVar5;
    pcVar6 = Monnam(mtmp);
    pline("%s stares piercingly at you!",pcVar6);
    make_stunned((ulong)(u.uprops[0x1b].intrinsic + iVar4),'\x01');
    stop_occupation();
    return 0;
  case '\x12':
    break;
  case '\x19':
    if ((*(uint *)&mtmp->field_0x60 >> 8 & 1) != 0) {
      return 0;
    }
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_002270b6;
      if ((u.uprops[0x1e].intrinsic != 0) ||
         (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
          (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
        if (ublindf == (obj *)0x0) {
          return 0;
        }
        if (ublindf->oartifact != '\x1d') {
          return 0;
        }
      }
      if (((u.uprops[0x40].intrinsic == 0) && (u.uprops[0x40].extrinsic == 0)) &&
         (((youmonst.data)->mflags3 & 0x100) == 0)) {
        return 0;
      }
      if ((mtmp->data->mflags3 & 0x200) == 0) {
        return 0;
      }
      bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
    }
    else {
      bVar2 = worm_known(level,mtmp);
    }
    if (bVar2 == 0) {
      return 0;
    }
LAB_002270b6:
    if ((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
       ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) {
      return 0;
    }
    if ((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0) {
      return 0;
    }
    if ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0) {
      return 0;
    }
    if (((byte)u._1052_1_ >> 5 & 1) != 0) {
      return 0;
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
      return 0;
    }
    if ((*(uint *)&mtmp->field_0x60 >> 0x11 & 1) == 0) {
      return 0;
    }
    if (mtmp->mspec_used != 0) {
      return 0;
    }
    iVar3 = rn2(5);
    if (iVar3 == 0) {
      return 0;
    }
    iVar4 = dice(3,4);
    iVar3 = mtmp->mspec_used;
    iVar5 = rn2(6);
    mtmp->mspec_used = iVar3 + iVar4 + iVar5;
    if (u.uprops[0x1c].intrinsic == 0) {
      pcVar6 = Monnam(mtmp);
      s_suffix(pcVar6);
      pline("%s gaze confuses you!");
    }
    else {
      pline("You are getting more and more confused.");
    }
    make_confused((ulong)(u.uprops[0x1c].intrinsic + iVar4),'\0');
    stop_occupation();
    return 0;
  }
  if ((((*(uint *)&mtmp->field_0x60 >> 8 & 1) != 0) ||
      ((*(uint *)&mtmp->field_0x60 >> 0x11 & 1) == 0)) ||
     (((u.uprops[0x23].intrinsic != 0 && (u.uprops[0x24].extrinsic == 0)) &&
      ((u.umonnum == u.umonster || (bVar1 = dmgtype(youmonst.data,0x24), bVar1 == '\0')))))) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00226623;
      if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
         || (((youmonst.data)->mflags1 & 0x1000) != 0)) {
        if (ublindf == (obj *)0x0) {
          return 0;
        }
        if (ublindf->oartifact != '\x1d') {
          return 0;
        }
      }
      if (((u.uprops[0x40].intrinsic == 0) && (u.uprops[0x40].extrinsic == 0)) &&
         (((youmonst.data)->mflags3 & 0x100) == 0)) {
        return 0;
      }
      if ((mtmp->data->mflags3 & 0x200) == 0) {
        return 0;
      }
      bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
    }
    else {
      bVar2 = worm_known(level,mtmp);
    }
    if (bVar2 == 0) {
      return 0;
    }
LAB_00226623:
    if ((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
       ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) {
      return 0;
    }
    if ((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0) {
      return 0;
    }
    if ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0) {
      return 0;
    }
    if (((byte)u._1052_1_ >> 5 & 1) != 0) {
      return 0;
    }
    pcVar6 = Monnam(mtmp);
    bVar8 = false;
    if (((mtmp->data == mons + 0x127) && (bVar8 = true, (*(uint *)&mtmp->field_0x60 >> 8 & 1) == 0))
       && (bVar8 = false, u.uprops[0x23].intrinsic != 0)) {
      bVar8 = true;
      if ((u.uprops[0x24].extrinsic == 0) && (bVar8 = false, u.umonnum != u.umonster)) {
        bVar1 = dmgtype(youmonst.data,0x24);
        bVar8 = bVar1 != '\0';
      }
      bVar8 = (bool)(bVar8 ^ 1);
    }
    pcVar7 = "gazes ineffectually";
    if (bVar8) {
      pcVar7 = "doesn\'t look all that ugly";
    }
    pline("%s %s.",pcVar6,pcVar7);
    return 0;
  }
  if (((u.uprops[0x2a].extrinsic == 0) &&
      ((youmonst.data != mons + 0x9d && (youmonst.data != mons + 0x94)))) ||
     (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0 || (mtmp->data != mons + 0x127)))) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00226dbf;
      if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
         || (((youmonst.data)->mflags1 & 0x1000) != 0)) {
        if (ublindf == (obj *)0x0) {
          return 0;
        }
        if (ublindf->oartifact != '\x1d') {
          return 0;
        }
      }
      if (((u.uprops[0x40].intrinsic == 0) && (u.uprops[0x40].extrinsic == 0)) &&
         (((youmonst.data)->mflags3 & 0x100) == 0)) {
        return 0;
      }
      if ((mtmp->data->mflags3 & 0x200) == 0) {
        return 0;
      }
      bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
    }
    else {
      bVar2 = worm_known(level,mtmp);
    }
    if (bVar2 == 0) {
      return 0;
    }
LAB_00226dbf:
    if (((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
        (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
      return 0;
    }
    if ((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0) {
      return 0;
    }
    if ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0) {
      return 0;
    }
    if (((byte)u._1052_1_ >> 5 & 1) != 0) {
      return 0;
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
      return 0;
    }
    if (u.uprops[8].extrinsic != 0) {
      return 0;
    }
    if ((youmonst.mintrinsics & 0x80) != 0) {
      return 0;
    }
    pcVar6 = mon_nam(mtmp);
    pcVar6 = s_suffix(pcVar6);
    pline("You meet %s gaze.",pcVar6);
    stop_occupation();
    bVar1 = poly_when_stoned(youmonst.data);
    if ((bVar1 != '\0') && (iVar3 = polymon(0x108), iVar3 != 0)) {
      return 0;
    }
    if (u.uprops[0x21].intrinsic == 0) {
      pline("You begin to turn into stone!");
    }
    pcVar6 = mons_mname(mtmp->data);
    delayed_petrify((char *)0x0,pcVar6);
    return 0;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (((((u.uprops[0x1e].intrinsic != 0) ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           ((bVar8 = false, ublindf == (obj *)0x0 || (bVar8 = false, ublindf->oartifact != '\x1d')))
           ) || ((u.uprops[0x40].intrinsic == 0 &&
                 ((u.uprops[0x40].extrinsic == 0 &&
                  (bVar8 = false, ((youmonst.data)->mflags3 & 0x100) == 0)))))) ||
         (bVar8 = false, (mtmp->data->mflags3 & 0x200) == 0)) goto LAB_00226a6e;
      bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x002269bb;
    }
  }
  else {
    bVar2 = worm_known(level,mtmp);
joined_r0x002269bb:
    bVar8 = false;
    if (bVar2 == 0) goto LAB_00226a6e;
  }
  if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) ||
      (bVar8 = false, ((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     (bVar8 = false, (*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0)) {
    bVar8 = (*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0 && ((byte)u._1052_1_ >> 5 & 1) == 0;
  }
LAB_00226a6e:
  if (bVar8) {
    pcVar6 = Monnam(mtmp);
    pcVar6 = s_suffix(pcVar6);
    ureflects("%s gaze is reflected by your %s.",pcVar6);
  }
  pcVar6 = "The gaze is reflected away by %s %s!";
  if (!bVar8) {
    pcVar6 = (char *)0x0;
  }
  bVar1 = mon_reflects(mtmp,pcVar6);
  if (bVar1 != '\0') {
    return 0;
  }
  if ((((((u.uprops[0xd].intrinsic != 0) || (u.uprops[0xd].extrinsic != 0)) ||
        ((youmonst.data == mons + 0x9e || (youmonst.data == mons + 0x7b)))) &&
       ((u.uprops[0xd].blocked == 0 && ((mtmp->data->mflags1 & 0x1000000) == 0)))) ||
      (((byte)u._1052_1_ >> 1 & 1) != 0)) ||
     (((((byte)u._1052_1_ >> 5 & 1) != 0 || ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0)) ||
      ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0)))) {
    if (!bVar8) {
      return 0;
    }
    pcVar6 = Monnam(mtmp);
    iVar3 = pronoun_gender(level,mtmp);
    pline("%s doesn\'t seem to notice that %s gaze was reflected.",pcVar6,genders[iVar3].his);
    return 0;
  }
  if (bVar8) {
    pcVar6 = Monnam(mtmp);
    pline("%s is turned to stone!",pcVar6);
  }
  stoned = '\x01';
  killed(mtmp);
  if (0 < mtmp->mhp) {
    return 0;
  }
  return 2;
}

Assistant:

int gazemu(struct monst *mtmp, const struct attack *mattk)
{
	switch(mattk->adtyp) {
	    case AD_STON:
		if (mtmp->mcan || !mtmp->mcansee || Hallucination) {
		    if (!canseemon(level, mtmp)) break;	/* silently */
		    pline("%s %s.", Monnam(mtmp),
			  (mtmp->data == &mons[PM_MEDUSA] &&
			   (mtmp->mcan || Hallucination)) ?
				"doesn't look all that ugly" :
				"gazes ineffectually");
		    break;
		}
		if (Reflecting && couldsee(mtmp->mx, mtmp->my) &&
			mtmp->data == &mons[PM_MEDUSA]) {
		    /* hero has line of sight to Medusa and she's not blind */
		    boolean useeit = canseemon(level, mtmp);

		    if (useeit)
			ureflects("%s gaze is reflected by your %s.",
					 s_suffix(Monnam(mtmp)));
		    if (mon_reflects(mtmp, !useeit ? NULL :
				     "The gaze is reflected away by %s %s!"))
			break;
		    if (!m_canseeu(mtmp)) { /* probably you're invisible */
			if (useeit)
			    pline(
		      "%s doesn't seem to notice that %s gaze was reflected.",
				  Monnam(mtmp), mhis(level, mtmp));
			break;
		    }
		    if (useeit)
			pline("%s is turned to stone!", Monnam(mtmp));
		    stoned = TRUE;
		    killed(mtmp);

		    if (mtmp->mhp > 0) break;
		    return 2;
		}
		if (canseemon(level, mtmp) && couldsee(mtmp->mx, mtmp->my) &&
		    !Stone_resistance) {
		    pline("You meet %s gaze.", s_suffix(mon_nam(mtmp)));
		    stop_occupation();
		    if (poly_when_stoned(youmonst.data) && polymon(PM_STONE_GOLEM))
			break;
		    if (!Stoned) pline("You begin to turn into stone!");
		    delayed_petrify(NULL, mons_mname(mtmp->data));
		}
		break;
	    case AD_CONF:
		if (!mtmp->mcan && canseemon(level, mtmp) &&
		   couldsee(mtmp->mx, mtmp->my) &&
		   mtmp->mcansee && !mtmp->mspec_used && rn2(5)) {
		    int conf = dice(3,4);

		    mtmp->mspec_used = mtmp->mspec_used + (conf + rn2(6));
		    if (!Confusion)
			pline("%s gaze confuses you!",
			                  s_suffix(Monnam(mtmp)));
		    else
			pline("You are getting more and more confused.");
		    make_confused(HConfusion + conf, FALSE);
		    stop_occupation();
		}
		break;
	    case AD_STUN:
		if (!mtmp->mcan && canseemon(level, mtmp) &&
		   couldsee(mtmp->mx, mtmp->my) &&
		   mtmp->mcansee && !mtmp->mspec_used && rn2(5)) {
		    int stun = dice(2,6);

		    mtmp->mspec_used = mtmp->mspec_used + (stun + rn2(6));
		    pline("%s stares piercingly at you!", Monnam(mtmp));
		    make_stunned(HStun + stun, TRUE);
		    stop_occupation();
		}
		break;
	    case AD_BLND:
		if (!mtmp->mcan && canseemon(level, mtmp) && !resists_blnd(&youmonst)
			&& distu(mtmp->mx,mtmp->my) <= BOLT_LIM*BOLT_LIM) {
		    int blnd = dice((int)mattk->damn, (int)mattk->damd);

		    pline("You are blinded by %s radiance!",
			              s_suffix(mon_nam(mtmp)));
		    make_blinded((long)blnd,FALSE);
		    stop_occupation();
		    /* not blind at this point implies you're wearing
		       the Eyes of the Overworld; make them block this
		       particular stun attack too */
		    if (!Blind) pline("Your vision quickly clears.");
		    else make_stunned((long)dice(1,3),TRUE);
		}
		break;
	    case AD_FIRE:
		if (!mtmp->mcan && canseemon(level, mtmp) &&
			couldsee(mtmp->mx, mtmp->my) &&
			mtmp->mcansee && !mtmp->mspec_used && rn2(5)) {
		    pline("%s attacks you with a fiery gaze!", Monnam(mtmp));
		    fire_damageu(dice(2, 6), mtmp, NULL, 0,
				 mtmp->m_lev, TRUE, FALSE);
		    stop_occupation();
		}
		break;
#ifdef PM_BEHOLDER /* work in progress */
	    case AD_SLEE:
		if (!mtmp->mcan && canseemon(mtmp) &&
		   couldsee(mtmp->mx, mtmp->my) && mtmp->mcansee &&
		   multi >= 0 && !rn2(5) && !FSleep_resistance) {

		    fall_asleep(-rnd(PSleep_resistance ? 5 : 10), TRUE);
		    pline("%s gaze makes you very sleepy...",
			  s_suffix(Monnam(mtmp)));
		}
		break;
	    case AD_SLOW:
		if (!mtmp->mcan && canseemon(mtmp) && mtmp->mcansee &&
		   (HFast & (INTRINSIC|TIMEOUT)) &&
		   !defends(AD_SLOW, uwep) && !rn2(4))

		    u_slow_down();
		    stop_occupation();
		break;
#endif
	    default: warning("Gaze attack %d?", mattk->adtyp);
		break;
	}
	return 0;
}